

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  ImVector<ImGuiWindow_*> *in_RSI;
  uint *in_RDI;
  int i;
  void *unaff_retaddr;
  char *in_stack_00000060;
  ImGuiWindow *in_stack_00000068;
  uint i_00;
  
  bVar1 = TreeNode((char *)in_RSI,"%s (%d)",in_RSI,(ulong)*in_RDI);
  if (bVar1) {
    Text("(In front-to-back order:)");
    i_00 = *in_RDI;
    while (i_00 = i_00 - 1, -1 < (int)i_00) {
      ImVector<ImGuiWindow_*>::operator[](in_RSI,i_00);
      PushID(unaff_retaddr);
      ImVector<ImGuiWindow_*>::operator[](in_RSI,i_00);
      DebugNodeWindow(in_stack_00000068,in_stack_00000060);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow*>* windows, const char* label)
{
    if (!TreeNode(label, "%s (%d)", label, windows->Size))
        return;
    Text("(In front-to-back order:)");
    for (int i = windows->Size - 1; i >= 0; i--) // Iterate front to back
    {
        PushID((*windows)[i]);
        DebugNodeWindow((*windows)[i], "Window");
        PopID();
    }
    TreePop();
}